

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O2

void __thiscall duckdb_re2::NFA::~NFA(NFA *this)

{
  _Elt_pointer pTVar1;
  _Elt_pointer pTVar2;
  Thread *t;
  _Elt_pointer pTVar3;
  _Map_pointer ppTVar4;
  
  if (this->match_ != (char **)0x0) {
    operator_delete__(this->match_);
  }
  pTVar3 = (this->arena_).
           super__Deque_base<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
  pTVar2 = (this->arena_).
           super__Deque_base<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>.
           _M_impl.super__Deque_impl_data._M_start._M_last;
  ppTVar4 = (this->arena_).
            super__Deque_base<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>.
            _M_impl.super__Deque_impl_data._M_start._M_node;
  pTVar1 = (this->arena_).
           super__Deque_base<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  while (pTVar3 != pTVar1) {
    if (pTVar3->capture != (char **)0x0) {
      operator_delete__(pTVar3->capture);
    }
    pTVar3 = pTVar3 + 1;
    if (pTVar3 == pTVar2) {
      pTVar3 = ppTVar4[1];
      ppTVar4 = ppTVar4 + 1;
      pTVar2 = pTVar3 + 0x20;
    }
  }
  std::_Deque_base<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>::~_Deque_base
            (&(this->arena_).
              super__Deque_base<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>);
  std::
  unique_ptr<duckdb_re2::NFA::AddState[],_duckdb_re2::PODArray<duckdb_re2::NFA::AddState>::Deleter>
  ::~unique_ptr(&(this->stack_).ptr_);
  SparseArray<duckdb_re2::NFA::Thread_*>::~SparseArray(&this->q1_);
  SparseArray<duckdb_re2::NFA::Thread_*>::~SparseArray(&this->q0_);
  return;
}

Assistant:

NFA::~NFA() {
  delete[] match_;
  for (const Thread& t : arena_)
    delete[] t.capture;
}